

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O1

void cmSourceFileSetProperty(void *arg,char *prop,char *value)

{
  cmSourceFile *this;
  size_t sVar1;
  char *__s;
  allocator<char> local_69;
  string local_68;
  long *local_48 [2];
  long local_38 [2];
  
  this = *arg;
  if (this == (cmSourceFile *)0x0) {
    if (prop == (char *)0x0) {
      return;
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    sVar1 = strlen(prop);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,prop,prop + sVar1);
    __s = "NOTFOUND";
    if (value != (char *)0x0) {
      __s = value;
    }
    local_48[0] = local_38;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,__s,__s + sVar1);
    cmPropertyMap::SetProperty((cmPropertyMap *)((long)arg + 0x80),&local_68,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return;
    }
  }
  else {
    if (value == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,prop,(allocator<char> *)local_48);
      cmSourceFile::SetProperty(this,&local_68,(cmValue)0x0);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,prop,&local_69);
      local_48[0] = local_38;
      sVar1 = strlen(value);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,value,value + sVar1);
      cmSourceFile::SetProperty(this,&local_68,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return;
    }
  }
  operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

static void CCONV cmSourceFileSetProperty(void* arg, const char* prop,
                                          const char* value)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if (cmSourceFile* rsf = sf->RealSourceFile) {
    if (!value) {
      rsf->RemoveProperty(prop);
    } else {
      rsf->SetProperty(prop, value);
    }
  } else if (prop) {
    if (!value) {
      value = "NOTFOUND";
    }
    sf->Properties.SetProperty(prop, value);
  }
}